

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Erase(ShardedLRUCache *this,Slice *key)

{
  long lVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  LRUHandle *e;
  undefined8 uVar5;
  Mutex *__mutex;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = Hash(key->data_,key->size_,0);
  uVar3 = uVar2 >> 0x1c;
  __mutex = &this->shard_[uVar3].mutex_;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 == 0) {
    e = HandleTable::Remove(&this->shard_[uVar3].table_,(Slice *)key->data_,(uint32_t)key->size_);
    LRUCache::FinishErase(this->shard_ + uVar3,e);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    uVar5 = std::__throw_system_error(iVar4);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar5);
    }
  }
  __stack_chk_fail();
}

Assistant:

void Erase(const Slice& key) override {
    const uint32_t hash = HashSlice(key);
    shard_[Shard(hash)].Erase(key, hash);
  }